

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O2

bool check_valid(char *chesses,int row,int col)

{
  if (col - 0x10U < 0xfffffff1 || row - 0x10U < 0xfffffff1) {
    return false;
  }
  return chesses[(ulong)(uint)col + (ulong)(uint)(row * 0xf) + -0x10] == '\0';
}

Assistant:

bool check_valid(char chesses[], int row, int col) {
    if (row <= 0 || row > 15 || col <= 0 || col > 15) {
        return false;
    }

    int index = (row - 1) * 15 + (col - 1);
    if (chesses[index] != 0) {
        return false;
    }

    return true;
}